

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmfilnam.cpp
# Opt level: O1

int CVmObjFileName::s_getp_getRootDirs(vm_val_t *retval,uint *oargc)

{
  CVmObjPageEntry *this;
  anon_union_8_8_cb74652f_for_val aVar1;
  undefined4 uVar2;
  vm_val_t *pvVar3;
  long lVar4;
  void *pvVar5;
  int iVar6;
  vm_obj_id_t vVar7;
  int iVar8;
  size_t sVar9;
  char *pcVar10;
  size_t sVar11;
  ulong uVar12;
  long lVar13;
  uint uVar14;
  long *in_FS_OFFSET;
  char *lclstr;
  vm_val_t ele;
  err_frame_t err_cur__;
  char *local_130;
  char *local_128;
  vm_val_t local_120;
  uint local_110 [2];
  long local_108;
  void *local_100;
  __jmp_buf_tag local_f8;
  
  if (oargc == (uint *)0x0) {
    lVar13 = 0;
  }
  else {
    lVar13 = (long)(int)*oargc;
  }
  if (s_getp_getRootDirs(vm_val_t*,unsigned_int*)::desc == '\0') {
    s_getp_getRootDirs();
  }
  iVar6 = CVmObject::get_prop_check_argc(retval,oargc,&s_getp_getRootDirs::desc);
  if (iVar6 == 0) {
    iVar6 = CVmNetFile::is_net_mode();
    if ((iVar6 == 0) && (sVar9 = os_get_root_dirs((char *)0x0,0), sVar9 != 0)) {
      pcVar10 = (char *)operator_new__(sVar9);
      local_130 = (char *)0x0;
      G_err_frame::__tls_init();
      local_108 = *in_FS_OFFSET;
      G_err_frame::__tls_init();
      *in_FS_OFFSET = (long)local_110;
      local_110[0] = _setjmp(&local_f8);
      if (local_110[0] == 0) {
        os_get_root_dirs(pcVar10,sVar9);
        uVar14 = 0;
        local_128 = pcVar10;
        if (*pcVar10 == '\0') {
          sVar9 = 0;
        }
        else {
          do {
            iVar6 = CVmObjFile::query_safety_for_open(pcVar10,0x1001);
            uVar14 = (uVar14 + 1) - (uint)(iVar6 == 0);
            sVar11 = strlen(pcVar10);
            pcVar10 = pcVar10 + sVar11 + 1;
          } while (*pcVar10 != '\0');
          sVar9 = (size_t)uVar14;
        }
        vVar7 = CVmObjList::create(0,sVar9);
        retval->typ = VM_OBJ;
        (retval->val).obj = vVar7;
        (**(code **)(*(long *)&G_obj_table_X.pages_[vVar7 >> 0xc][vVar7 & 0xfff].ptr_ + 8))
                  (G_obj_table_X.pages_[vVar7 >> 0xc] + (vVar7 & 0xfff),CVmObjList::metaclass_reg_);
        this = G_obj_table_X.pages_[(retval->val).obj >> 0xc] + ((retval->val).obj & 0xfff);
        uVar12 = (ulong)**(ushort **)((long)&this->ptr_ + 8);
        if (uVar12 != 0) {
          CVmObjList::cons_clear((CVmObjList *)this,0,uVar12 - 1);
        }
        pvVar3 = sp_;
        uVar2 = *(undefined4 *)&retval->field_0x4;
        aVar1 = retval->val;
        sp_ = sp_ + 1;
        pvVar3->typ = retval->typ;
        *(undefined4 *)&pvVar3->field_0x4 = uVar2;
        pvVar3->val = aVar1;
        if (*local_128 != '\0') {
          iVar6 = 0;
          pcVar10 = local_128;
          do {
            iVar8 = CVmObjFile::query_safety_for_open(pcVar10,0x1001);
            if (iVar8 != 0) {
              sVar9 = CCharmapToUni::map_str_alo(G_cmap_from_fname_X,&local_130,pcVar10);
              local_120.val.obj = create_from_local(local_130,sVar9);
              local_120.typ = VM_OBJ;
              free(local_130);
              local_130 = (char *)0x0;
              sVar9 = (size_t)iVar6;
              iVar6 = iVar6 + 1;
              CVmObjList::cons_set_element((CVmObjList *)this,sVar9,&local_120);
            }
            sVar11 = strlen(pcVar10);
            pcVar10 = pcVar10 + sVar11 + 1;
          } while (*pcVar10 != '\0');
        }
        sp_ = sp_ + -1;
        pcVar10 = local_128;
      }
      if (-1 < (short)local_110[0]) {
        local_110[0] = local_110[0] | 0x8000;
        operator_delete__(pcVar10);
        if (local_130 != (char *)0x0) {
          free(local_130);
        }
      }
      lVar4 = local_108;
      G_err_frame::__tls_init();
      *in_FS_OFFSET = lVar4;
      if ((local_110[0] & 0x4001) != 0) {
        G_err_frame::__tls_init();
        if ((*(byte *)*in_FS_OFFSET & 2) != 0) {
          G_err_frame::__tls_init();
          free(*(void **)(*in_FS_OFFSET + 0x10));
        }
        pvVar5 = local_100;
        G_err_frame::__tls_init();
        *(void **)(*in_FS_OFFSET + 0x10) = pvVar5;
        err_rethrow();
      }
      if ((local_110[0] & 2) != 0) {
        free(local_100);
      }
    }
    else {
      vVar7 = CVmObjList::create(0,0);
      retval->typ = VM_OBJ;
      (retval->val).obj = vVar7;
    }
    sp_ = sp_ + -lVar13;
  }
  return 1;
}

Assistant:

int CVmObjFileName::s_getp_getRootDirs(VMG_ vm_val_t *retval, uint *oargc)
{
    /* check arguments */
    uint argc = (oargc != 0 ? *oargc : 0);
    static CVmNativeCodeDesc desc(0);
    if (get_prop_check_argc(retval, oargc, &desc))
        return TRUE;

    /* 
     *   See how much space we need for the root list.  If we're in network
     *   storage mode, there's no concept of a root folder, since everything
     *   is relative to the user+game folder.
     */
    size_t buflen;
    if (!CVmNetFile::is_net_mode(vmg0_)
        && (buflen = os_get_root_dirs(0, 0)) != 0)
    {
        /* allocate space */
        char *buf = new char[buflen];
        char *lclstr = 0;
        err_try
        {
            /* get the root list for real this time */
            os_get_root_dirs(buf, buflen);

            /* count the strings in the list, filtered for file safety */
            int cnt = 0;
            char *p;
            for (p = buf ; *p != '\0' ; p += strlen(p) + 1)
            {
                /* if we're allowed to get metadata on this path, count it */
                if (CVmObjFile::query_safety_for_open(
                    vmg_ p, VMOBJFILE_ACCESS_GETINFO))
                    ++cnt;
            }

            /* create the list; clear it and push it for gc protection */
            retval->set_obj(CVmObjList::create(vmg_ FALSE, cnt));
            CVmObjList *lst = vm_objid_cast(CVmObjList, retval->val.obj);
            lst->cons_clear();
            G_stk->push(retval);

            /* build the list */
            for (p = buf, cnt = 0 ; *p != '\0' ; p += strlen(p) + 1)
            {
                /* check to see if we're allowed to access this root */
                if (CVmObjFile::query_safety_for_open(
                    vmg_ p, VMOBJFILE_ACCESS_GETINFO))
                {
                    /* map the string to utf8 */
                    size_t len = G_cmap_from_fname->map_str_alo(&lclstr, p);

                    /* create the FileName object */
                    vm_val_t ele;
                    ele.set_obj(create_from_local(vmg_ lclstr, len));

                    /* done with the mapped string */
                    t3free(lclstr);
                    lclstr = 0;
                    
                    /* add it to the list */
                    lst->cons_set_element(cnt++, &ele);
                }
            }

            /* done with our gc protection for the list */
            G_stk->discard();
        }
        err_finally
        {
            /* free the root list buffer */
            delete [] buf;

            /* free the mapped filename string */
            if (lclstr != 0)
                t3free(lclstr);
        }